

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

worker_state worker_encode(worker_thread *thr,worker_state state)

{
  ulong out_size_00;
  lzma_vli lVar1;
  bool bVar2;
  uint mythread_j_304;
  uint mythread_i_304;
  size_t in_limit;
  lzma_action action;
  uint mythread_j_241;
  uint mythread_i_241;
  size_t out_size;
  size_t in_size;
  size_t in_pos;
  undefined1 local_f8 [4];
  lzma_ret ret;
  lzma_check local_f0;
  size_t local_e8;
  size_t local_e0;
  lzma_filter *local_d8;
  worker_state local_24;
  worker_thread *pwStack_20;
  worker_state state_local;
  worker_thread *thr_local;
  
  local_24 = state;
  pwStack_20 = thr;
  if (thr->progress_in != 0) {
    __assert_fail("thr->progress_in == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0xc9,"worker_state worker_encode(worker_thread *, worker_state)");
  }
  if (thr->progress_out != 0) {
    __assert_fail("thr->progress_out == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0xca,"worker_state worker_encode(worker_thread *, worker_state)");
  }
  memset(local_f8,0,0xd0);
  local_f0 = (pwStack_20->coder->stream_flags).check;
  local_e8 = (pwStack_20->coder->outq).buf_size_max;
  local_e0 = pwStack_20->coder->block_size;
  local_d8 = pwStack_20->coder->filters;
  memcpy(&thr->block_options,local_f8,0xd0);
  in_pos._4_4_ = lzma_block_header_size(&pwStack_20->block_options);
  if (in_pos._4_4_ == LZMA_OK) {
    in_pos._4_4_ = lzma_block_encoder_init
                             (&pwStack_20->block_encoder,pwStack_20->allocator,
                              &pwStack_20->block_options);
    if (in_pos._4_4_ == LZMA_OK) {
      in_size = 0;
      out_size = 0;
      pwStack_20->outbuf->size = (ulong)(pwStack_20->block_options).header_size;
      out_size_00 = (pwStack_20->coder->outq).buf_size_max;
      in_pos._4_4_ = LZMA_OK;
      do {
        bVar2 = false;
        while (!bVar2) {
          mythread_mutex_lock(&pwStack_20->mutex);
          bVar2 = false;
          while (!bVar2) {
            pwStack_20->progress_in = in_size;
            pwStack_20->progress_out = pwStack_20->outbuf->size;
            while( true ) {
              bVar2 = false;
              if (out_size == pwStack_20->in_size) {
                bVar2 = pwStack_20->state == THR_RUN;
              }
              if (!bVar2) break;
              mythread_cond_wait(&pwStack_20->cond,&pwStack_20->mutex);
            }
            local_24 = pwStack_20->state;
            out_size = pwStack_20->in_size;
            bVar2 = true;
          }
          bVar2 = true;
        }
        mythread_mutex_unlock(&pwStack_20->mutex);
        if (THR_FINISH < local_24) {
          return local_24;
        }
        in_limit._4_4_ = LZMA_RUN;
        if (local_24 == THR_FINISH) {
          in_limit._4_4_ = LZMA_FINISH;
        }
        _mythread_j_304 = out_size;
        if (0x4000 < out_size - in_size) {
          _mythread_j_304 = in_size + 0x4000;
          in_limit._4_4_ = LZMA_RUN;
        }
        in_pos._4_4_ = (*(pwStack_20->block_encoder).code)
                                 ((pwStack_20->block_encoder).coder,pwStack_20->allocator,
                                  pwStack_20->in,&in_size,_mythread_j_304,pwStack_20->outbuf->buf,
                                  &pwStack_20->outbuf->size,out_size_00,in_limit._4_4_);
        bVar2 = false;
        if (in_pos._4_4_ == LZMA_OK) {
          bVar2 = pwStack_20->outbuf->size < out_size_00;
        }
      } while (bVar2);
      if (in_pos._4_4_ == LZMA_OK) {
        in_pos._4_4_ = 0;
        bVar2 = false;
        while (!bVar2) {
          mythread_mutex_lock(&pwStack_20->mutex);
          bVar2 = false;
          while (!bVar2) {
            while (pwStack_20->state == THR_RUN) {
              mythread_cond_wait(&pwStack_20->cond,&pwStack_20->mutex);
            }
            local_24 = pwStack_20->state;
            out_size = pwStack_20->in_size;
            bVar2 = true;
          }
          bVar2 = true;
        }
        mythread_mutex_unlock(&pwStack_20->mutex);
        if (THR_FINISH < local_24) {
          return local_24;
        }
        pwStack_20->outbuf->size = 0;
        in_pos._4_4_ = lzma_block_uncomp_encode
                                 (&pwStack_20->block_options,pwStack_20->in,out_size,
                                  pwStack_20->outbuf->buf,&pwStack_20->outbuf->size,out_size_00);
        if (in_pos._4_4_ != LZMA_OK) {
          worker_error(pwStack_20,LZMA_PROG_ERROR);
          return THR_STOP;
        }
      }
      else {
        if (in_pos._4_4_ != LZMA_STREAM_END) {
          worker_error(pwStack_20,in_pos._4_4_);
          return THR_STOP;
        }
        if (local_24 != THR_FINISH) {
          __assert_fail("state == THR_FINISH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                        ,0x11d,"worker_state worker_encode(worker_thread *, worker_state)");
        }
        in_pos._4_4_ = lzma_block_header_encode(&pwStack_20->block_options,pwStack_20->outbuf->buf);
        if (in_pos._4_4_ != LZMA_OK) {
          worker_error(pwStack_20,in_pos._4_4_);
          return THR_STOP;
        }
      }
      in_pos._4_4_ = 0;
      lVar1 = lzma_block_unpadded_size(&pwStack_20->block_options);
      pwStack_20->outbuf->unpadded_size = lVar1;
      if (pwStack_20->outbuf->unpadded_size == 0) {
        __assert_fail("thr->outbuf->unpadded_size != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                      ,0x152,"worker_state worker_encode(worker_thread *, worker_state)");
      }
      pwStack_20->outbuf->uncompressed_size = (pwStack_20->block_options).uncompressed_size;
      thr_local._4_4_ = THR_FINISH;
    }
    else {
      worker_error(pwStack_20,in_pos._4_4_);
      thr_local._4_4_ = THR_STOP;
    }
  }
  else {
    worker_error(pwStack_20,in_pos._4_4_);
    thr_local._4_4_ = THR_STOP;
  }
  return thr_local._4_4_;
}

Assistant:

static worker_state
worker_encode(worker_thread *thr, worker_state state)
{
	assert(thr->progress_in == 0);
	assert(thr->progress_out == 0);

	// Set the Block options.
	thr->block_options = (lzma_block){
		.version = 0,
		.check = thr->coder->stream_flags.check,
		.compressed_size = thr->coder->outq.buf_size_max,
		.uncompressed_size = thr->coder->block_size,

		// TODO: To allow changing the filter chain, the filters
		// array must be copied to each worker_thread.
		.filters = thr->coder->filters,
	};

	// Calculate maximum size of the Block Header. This amount is
	// reserved in the beginning of the buffer so that Block Header
	// along with Compressed Size and Uncompressed Size can be
	// written there.
	lzma_ret ret = lzma_block_header_size(&thr->block_options);
	if (ret != LZMA_OK) {
		worker_error(thr, ret);
		return THR_STOP;
	}

	// Initialize the Block encoder.
	ret = lzma_block_encoder_init(&thr->block_encoder,
			thr->allocator, &thr->block_options);
	if (ret != LZMA_OK) {
		worker_error(thr, ret);
		return THR_STOP;
	}

	size_t in_pos = 0;
	size_t in_size = 0;

	thr->outbuf->size = thr->block_options.header_size;
	const size_t out_size = thr->coder->outq.buf_size_max;

	do {
		mythread_sync(thr->mutex) {
			// Store in_pos and out_pos into *thr so that
			// an application may read them via
			// lzma_get_progress() to get progress information.
			//
			// NOTE: These aren't updated when the encoding
			// finishes. Instead, the final values are taken
			// later from thr->outbuf.
			thr->progress_in = in_pos;
			thr->progress_out = thr->outbuf->size;

			while (in_size == thr->in_size
					&& thr->state == THR_RUN)
				mythread_cond_wait(&thr->cond, &thr->mutex);

			state = thr->state;
			in_size = thr->in_size;
		}

		// Return if we were asked to stop or exit.
		if (state >= THR_STOP)
			return state;

		lzma_action action = state == THR_FINISH
				? LZMA_FINISH : LZMA_RUN;

		// Limit the amount of input given to the Block encoder
		// at once. This way this thread can react fairly quickly
		// if the main thread wants us to stop or exit.
		static const size_t in_chunk_max = 16384;
		size_t in_limit = in_size;
		if (in_size - in_pos > in_chunk_max) {
			in_limit = in_pos + in_chunk_max;
			action = LZMA_RUN;
		}

		ret = thr->block_encoder.code(
				thr->block_encoder.coder, thr->allocator,
				thr->in, &in_pos, in_limit, thr->outbuf->buf,
				&thr->outbuf->size, out_size, action);
	} while (ret == LZMA_OK && thr->outbuf->size < out_size);

	switch (ret) {
	case LZMA_STREAM_END:
		assert(state == THR_FINISH);

		// Encode the Block Header. By doing it after
		// the compression, we can store the Compressed Size
		// and Uncompressed Size fields.
		ret = lzma_block_header_encode(&thr->block_options,
				thr->outbuf->buf);
		if (ret != LZMA_OK) {
			worker_error(thr, ret);
			return THR_STOP;
		}

		break;

	case LZMA_OK:
		// The data was incompressible. Encode it using uncompressed
		// LZMA2 chunks.
		//
		// First wait that we have gotten all the input.
		mythread_sync(thr->mutex) {
			while (thr->state == THR_RUN)
				mythread_cond_wait(&thr->cond, &thr->mutex);

			state = thr->state;
			in_size = thr->in_size;
		}

		if (state >= THR_STOP)
			return state;

		// Do the encoding. This takes care of the Block Header too.
		thr->outbuf->size = 0;
		ret = lzma_block_uncomp_encode(&thr->block_options,
				thr->in, in_size, thr->outbuf->buf,
				&thr->outbuf->size, out_size);

		// It shouldn't fail.
		if (ret != LZMA_OK) {
			worker_error(thr, LZMA_PROG_ERROR);
			return THR_STOP;
		}

		break;

	default:
		worker_error(thr, ret);
		return THR_STOP;
	}

	// Set the size information that will be read by the main thread
	// to write the Index field.
	thr->outbuf->unpadded_size
			= lzma_block_unpadded_size(&thr->block_options);
	assert(thr->outbuf->unpadded_size != 0);
	thr->outbuf->uncompressed_size = thr->block_options.uncompressed_size;

	return THR_FINISH;
}